

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

void __thiscall implementations::scheme::cell::cell(cell *this,cell *copy)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  this->type = copy->type;
  (this->val)._M_dataplus._M_p = (pointer)&(this->val).field_2;
  pcVar1 = (copy->val)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->val,pcVar1,pcVar1 + (copy->val)._M_string_length);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::vector
            (&this->list,&copy->list);
  this->proc = copy->proc;
  (this->env).super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (copy->env).
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (copy->env).
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->env).super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

cell(const cell &copy) : type(copy.type), val(copy.val), list(copy.list), proc(copy.proc), env(copy.env) {}